

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O1

Action __thiscall
psy::C::DeclarationBinder::visitStructOrUnionDeclaration_AtSpecifier
          (DeclarationBinder *this,StructOrUnionDeclarationSyntax *node)

{
  TagTypeSpecifierSyntax *this_00;
  Action AVar1;
  SyntaxKind SVar2;
  Identifier *pIVar3;
  TagType *pTVar4;
  ostream *poVar5;
  DeclarationListSyntax *pDVar6;
  SyntaxToken SStack_58;
  
  this_00 = (node->super_TagDeclarationSyntax).typeSpec_;
  SVar2 = SyntaxNode::kind((SyntaxNode *)this_00);
  if (SVar2 == UnionTypeSpecifier) {
    SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)this_00,this_00->tagTkIdx_);
    pIVar3 = obtainTag(this,&SStack_58);
    pTVar4 = makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                       (this,Union,pIVar3);
    SyntaxToken::~SyntaxToken(&SStack_58);
    bindDeclaration<psy::C::UnionDeclarationSymbol,psy::C::TagType*>(this,(SyntaxNode *)node,pTVar4)
    ;
  }
  else {
    if (SVar2 != StructTypeSpecifier) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/DeclarationBinder_Specifiers.cpp"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x46);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<empty message>",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      return Quit;
    }
    SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)this_00,this_00->tagTkIdx_);
    pIVar3 = obtainTag(this,&SStack_58);
    pTVar4 = makeType<psy::C::TagType,psy::C::TagTypeKind,psy::C::Identifier_const*>
                       (this,Struct,pIVar3);
    SyntaxToken::~SyntaxToken(&SStack_58);
    bindDeclaration<psy::C::StructDeclarationSymbol,psy::C::TagType*>
              (this,(SyntaxNode *)node,pTVar4);
  }
  pDVar6 = ((node->super_TagDeclarationSyntax).typeSpec_)->decls_;
  while( true ) {
    if (pDVar6 == (DeclarationListSyntax *)0x0) {
      AVar1 = visitStructOrUnionDeclaration_AtEnd(this,node);
      return AVar1;
    }
    AVar1 = SyntaxVisitor::visit
                      (&this->super_SyntaxVisitor,
                       &((pDVar6->
                         super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                         ).
                         super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                        .value)->super_SyntaxNode);
    if (AVar1 == Quit) break;
    pDVar6 = (pDVar6->
             super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             ).
             super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             .next;
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitStructOrUnionDeclaration_AtSpecifier(
        const StructOrUnionDeclarationSyntax* node)
{
    const TagTypeSpecifierSyntax* tySpec = node->typeSpecifier();
    switch (tySpec->kind()) {
        case SyntaxKind::StructTypeSpecifier: {
            auto tagTy = makeType<TagType>(
                        TagTypeKind::Struct,
                        obtainTag(tySpec->tagToken()));
            bindDeclaration<StructDeclarationSymbol>(node, tagTy);
            break;
        }
        case SyntaxKind::UnionTypeSpecifier:{
            auto tagTy = makeType<TagType>(
                        TagTypeKind::Union,
                        obtainTag(tySpec->tagToken()));
            bindDeclaration<UnionDeclarationSymbol>(node, tagTy);
            break;
        }
        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }

    return visitTagDeclaration_AtMemberDeclarations(
                node,
                &DeclarationBinder::visitStructOrUnionDeclaration_AtEnd);
}